

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O0

void nn_term(void)

{
  int i;
  nn_mutex_t *unaff_retaddr;
  int in_stack_00000010;
  undefined4 local_4;
  
  nn_mutex_lock(unaff_retaddr);
  self.flags = self.flags | 2;
  nn_mutex_unlock(unaff_retaddr);
  for (local_4 = 0; local_4 < 0x200; local_4 = local_4 + 1) {
    nn_close(in_stack_00000010);
  }
  nn_mutex_lock(unaff_retaddr);
  self.flags = self.flags & 0xfffffffdU | 1;
  nn_condvar_broadcast((nn_condvar_t *)0x14cea2);
  nn_mutex_unlock(unaff_retaddr);
  return;
}

Assistant:

void nn_term (void)
{
    int i;

    nn_mutex_lock (&self.lock);
    self.flags |= NN_CTX_FLAG_TERMING;
    nn_mutex_unlock (&self.lock);

    /* Make sure we really close resources, this will cause global
       resources to be freed too when the last socket is closed. */
    for (i = 0; i < NN_MAX_SOCKETS; i++) {
        (void) nn_close (i);
    }

    nn_mutex_lock (&self.lock);
    self.flags |= NN_CTX_FLAG_TERMED;
    self.flags &= ~NN_CTX_FLAG_TERMING;
    nn_condvar_broadcast(&self.cond);
    nn_mutex_unlock (&self.lock);
}